

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,char *zType,int nSubquery)

{
  Expr *p;
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  sqlite3 *db;
  Expr *pDup;
  Expr *pOrig;
  int nSubquery_local;
  char *zType_local;
  Expr *pExpr_local;
  int iCol_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  p = pEList->a[iCol].pExpr;
  db_00 = pParse->db;
  db = (sqlite3 *)sqlite3ExprDup(db_00,p,0);
  if (db != (sqlite3 *)0x0) {
    if ((p->op != 0x98) && (*zType != 'G')) {
      incrAggFunctionDepth((Expr *)db,nSubquery);
      db = (sqlite3 *)sqlite3PExpr(pParse,0x18,(Expr *)db,(Expr *)0x0,(Token *)0x0);
      if (db == (sqlite3 *)0x0) {
        return;
      }
      if (pEList->a[iCol].iAlias == 0) {
        iVar1 = pParse->nAlias + 1;
        pParse->nAlias = iVar1;
        pEList->a[iCol].iAlias = (u16)iVar1;
      }
      db->flags = (uint)pEList->a[iCol].iAlias;
    }
    if (pExpr->op == '\\') {
      db = (sqlite3 *)sqlite3ExprAddCollateString(pParse,(Expr *)db,(pExpr->u).zToken);
    }
    pExpr->flags = pExpr->flags | 0x8000;
    sqlite3ExprDelete(db_00,pExpr);
    memcpy(pExpr,db,0x48);
    if (((pExpr->flags & 0x400) != 0x400) && ((pExpr->u).zToken != (char *)0x0)) {
      pcVar2 = sqlite3DbStrDup(db_00,(pExpr->u).zToken);
      (pExpr->u).zToken = pcVar2;
      pExpr->flags2 = pExpr->flags2 | 1;
    }
    sqlite3DbFree(db_00,db);
  }
  return;
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  const char *zType,     /* "GROUP" or "ORDER" or "" */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  assert( pOrig->flags & EP_Resolved );
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( pDup==0 ) return;
  if( pOrig->op!=TK_COLUMN && zType[0]!='G' ){
    incrAggFunctionDepth(pDup, nSubquery);
    pDup = sqlite3PExpr(pParse, TK_AS, pDup, 0, 0);
    if( pDup==0 ) return;
    if( pEList->a[iCol].iAlias==0 ){
      pEList->a[iCol].iAlias = (u16)(++pParse->nAlias);
    }
    pDup->iTable = pEList->a[iCol].iAlias;
  }
  if( pExpr->op==TK_COLLATE ){
    pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
  }

  /* Before calling sqlite3ExprDelete(), set the EP_Static flag. This 
  ** prevents ExprDelete() from deleting the Expr structure itself,
  ** allowing it to be repopulated by the memcpy() on the following line.
  ** The pExpr->u.zToken might point into memory that will be freed by the
  ** sqlite3DbFree(db, pDup) on the last line of this block, so be sure to
  ** make a copy of the token before doing the sqlite3DbFree().
  */
  ExprSetProperty(pExpr, EP_Static);
  sqlite3ExprDelete(db, pExpr);
  memcpy(pExpr, pDup, sizeof(*pExpr));
  if( !ExprHasProperty(pExpr, EP_IntValue) && pExpr->u.zToken!=0 ){
    assert( (pExpr->flags & (EP_Reduced|EP_TokenOnly))==0 );
    pExpr->u.zToken = sqlite3DbStrDup(db, pExpr->u.zToken);
    pExpr->flags2 |= EP2_MallocedToken;
  }
  sqlite3DbFree(db, pDup);
}